

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::ContextShaderProgram::shadeVertices
          (ContextShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int numComponents;
  GenericVecType GVar1;
  VertexPacket *pVVar2;
  UniformSlot *pUVar3;
  pointer pGVar4;
  long lVar5;
  VertexAttrib *vertexAttrib;
  Vec2 coord;
  Vec3 color;
  Vec2 local_84;
  undefined8 local_7c;
  float local_74;
  float local_70;
  float local_6c;
  Vec4 local_68;
  VertexAttrib *local_50;
  ulong local_48;
  VertexPacket **local_40;
  ulong local_38;
  
  local_50 = inputs;
  local_40 = packets;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_coordScale");
  local_6c = (pUVar3->value).f;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_colorScale");
  if (0 < numPackets) {
    local_70 = (pUVar3->value).f;
    local_48 = (ulong)(uint)numPackets;
    local_38 = 0;
    do {
      pVVar2 = local_40[local_38];
      local_84.m_data = (float  [2])&DAT_3f8000003f800000;
      local_7c = &DAT_3f8000003f800000;
      local_74 = 1.0;
      pGVar4 = (this->m_attrType).
               super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this->m_attrType).
                                  super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar4) >> 2))
      {
        lVar5 = 0;
        vertexAttrib = local_50;
        do {
          numComponents =
               (this->m_componentCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5];
          GVar1 = pGVar4[lVar5];
          if (GVar1 == GENERICVECTYPE_INT32) {
            local_68.m_data[0] = 0.0;
            local_68.m_data[1] = 0.0;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 0.0;
            rr::readVertexAttrib
                      ((IVec4 *)&local_68,vertexAttrib,pVVar2->instanceNdx,pVVar2->vertexNdx);
            calcShaderColorCoord<int>
                      (&local_84,(Vec3 *)&local_7c,(Vector<int,_4> *)&local_68,lVar5 == 0,
                       numComponents);
          }
          else if (GVar1 == GENERICVECTYPE_UINT32) {
            local_68.m_data[0] = 0.0;
            local_68.m_data[1] = 0.0;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 0.0;
            rr::readVertexAttrib
                      ((UVec4 *)&local_68,vertexAttrib,pVVar2->instanceNdx,pVVar2->vertexNdx);
            calcShaderColorCoord<unsigned_int>
                      (&local_84,(Vec3 *)&local_7c,(Vector<unsigned_int,_4> *)&local_68,lVar5 == 0,
                       numComponents);
          }
          else if (GVar1 == GENERICVECTYPE_FLOAT) {
            local_68.m_data[0] = 0.0;
            local_68.m_data[1] = 0.0;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 0.0;
            rr::readVertexAttrib(&local_68,vertexAttrib,pVVar2->instanceNdx,pVVar2->vertexNdx);
            calcShaderColorCoord<float>
                      (&local_84,(Vec3 *)&local_7c,&local_68,lVar5 == 0,numComponents);
          }
          lVar5 = lVar5 + 1;
          pGVar4 = (this->m_attrType).
                   super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          vertexAttrib = vertexAttrib + 1;
        } while (lVar5 < (int)((ulong)((long)(this->m_attrType).
                                             super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pGVar4) >> 2));
      }
      (pVVar2->position).m_data[0] = local_84.m_data[0] * local_6c;
      (pVVar2->position).m_data[1] = local_84.m_data[1] * local_6c;
      *(undefined1 **)((pVVar2->position).m_data + 2) = &DAT_3f8000003f800000;
      pVVar2->outputs[0].v.fData[0] = (float)local_7c * local_70;
      pVVar2->outputs[0].v.fData[1] = local_7c._4_4_ * local_70;
      pVVar2->outputs[0].v.fData[2] = local_74 * local_70;
      pVVar2->outputs[0].v.uData[3] = 0x3f800000;
      local_38 = local_38 + 1;
    } while (local_38 != local_48);
  }
  return;
}

Assistant:

void ContextShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	const float	u_coordScale = getUniformByName("u_coordScale").value.f;
	const float u_colorScale = getUniformByName("u_colorScale").value.f;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const size_t varyingLocColor = 0;

		rr::VertexPacket& packet = *packets[packetNdx];

		// Calc output color
		tcu::Vec2 coord = tcu::Vec2(1.0, 1.0);
		tcu::Vec3 color = tcu::Vec3(1.0, 1.0, 1.0);

		for (int attribNdx = 0; attribNdx < (int)m_attrType.size(); attribNdx++)
		{
			const int numComponents = m_componentCount[attribNdx];

			switch (m_attrType[attribNdx])
			{
				case rr::GENERICVECTYPE_FLOAT:	calcShaderColorCoord(coord, color, rr::readVertexAttribFloat(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), attribNdx == 0, numComponents);	break;
				case rr::GENERICVECTYPE_INT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribInt	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), attribNdx == 0, numComponents);	break;
				case rr::GENERICVECTYPE_UINT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribUint	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), attribNdx == 0, numComponents);	break;
				default:
					DE_ASSERT(false);
			}
		}

		// Transform position
		{
			packet.position = tcu::Vec4(u_coordScale * coord.x(), u_coordScale * coord.y(), 1.0f, 1.0f);
		}

		// Pass color to FS
		{
			packet.outputs[varyingLocColor] = tcu::Vec4(u_colorScale * color.x(), u_colorScale * color.y(), u_colorScale * color.z(), 1.0f);
		}
	}
}